

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stronghold.cpp
# Opt level: O1

void __thiscall Stronghold::Stronghold(Stronghold *this,string *n,int t,int h,int m,int d)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + n->_M_string_length)
  ;
  BlackCard::BlackCard(&this->super_BlackCard,&local_50,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001183f0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->honour = h;
  this->money = m;
  this->initialDefense = d;
  return;
}

Assistant:

Stronghold::Stronghold(string n, int t, int h, int m, int d) : BlackCard{n, t}
{
    name = n;
    honour = h;
    money = m;
    initialDefense = d;
}